

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O1

void __thiscall icu_63::UVector::UVector(UVector *this,int32_t initialCapacity,UErrorCode *status)

{
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__UVector_003b6750;
  this->count = 0;
  this->capacity = 0;
  this->elements = (UElement *)0x0;
  this->deleter = (UObjectDeleter *)0x0;
  this->comparer = (UElementsAreEqual *)0x0;
  _init(this,initialCapacity,status);
  return;
}

Assistant:

UVector::UVector(int32_t initialCapacity, UErrorCode &status) :
    count(0),
    capacity(0),
    elements(0),
    deleter(0),
    comparer(0)
{
    _init(initialCapacity, status);
}